

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O0

Box2i Imf_3_3::dataWindowForTile
                (TileDescription *tileDesc,int minX,int maxX,int minY,int maxY,int dx,int dy,int lx,
                int ly)

{
  int a;
  int *piVar1;
  long *plVar2;
  int in_EDX;
  Vec2<int> extraout_RDX;
  uint *in_RSI;
  Vec2<int> in_RDI;
  int in_R8D;
  Box2i BVar3;
  int in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000020;
  V2i tileMax;
  V2i levelMax;
  int64_t tileMaxY;
  int64_t tileMaxX;
  V2i tileMin;
  undefined4 in_stack_ffffffffffffff74;
  Vec2<int> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  long in_stack_ffffffffffffff98;
  long in_stack_ffffffffffffffa0;
  Vec2<int> in_stack_ffffffffffffffa8;
  Vec2<int> VStack_48;
  int in_stack_ffffffffffffffc0;
  long local_30;
  Vec2<int> local_28 [3];
  uint *local_10;
  
  local_10 = in_RSI;
  Imath_3_1::Vec2<int>::Vec2
            (local_28,in_EDX + in_stack_00000008 * *in_RSI,in_R8D + in_stack_00000010 * in_RSI[1]);
  piVar1 = Imath_3_1::Vec2<int>::operator[](local_28,0);
  local_30 = (long)*piVar1 + (ulong)*local_10 + -1;
  piVar1 = Imath_3_1::Vec2<int>::operator[](local_28,1);
  dataWindowForLevel((TileDescription *)in_stack_ffffffffffffffa8,
                     (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(int)in_stack_ffffffffffffffa0,
                     (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffffc0,*piVar1 + local_10[1] + -1);
  Imath_3_1::Vec2<int>::Vec2((Vec2<int> *)&stack0xffffffffffffffc0,&VStack_48);
  Imath_3_1::Vec2<int>::operator[]((Vec2<int> *)&stack0xffffffffffffffc0,0);
  plVar2 = std::min<long>(&local_30,(long *)&stack0xffffffffffffffa0);
  a = (int)*plVar2;
  Imath_3_1::Vec2<int>::operator[]((Vec2<int> *)&stack0xffffffffffffffc0,1);
  plVar2 = std::min<long>((long *)&stack0xffffffffffffffc8,(long *)&stack0xffffffffffffff98);
  Imath_3_1::Vec2<int>::Vec2((Vec2<int> *)&stack0xffffffffffffffa8,a,(int)*plVar2);
  Imath_3_1::Box<Imath_3_1::Vec2<int>_>::Box
            ((Box<Imath_3_1::Vec2<int>_> *)CONCAT44(a,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78,
             (Vec2<int> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_00000020));
  BVar3.max = extraout_RDX;
  BVar3.min = in_RDI;
  return BVar3;
}

Assistant:

Box2i
dataWindowForTile (
    const TileDescription& tileDesc,
    int                    minX,
    int                    maxX,
    int                    minY,
    int                    maxY,
    int                    dx,
    int                    dy,
    int                    lx,
    int                    ly)
{
    V2i tileMin = V2i (minX + dx * tileDesc.xSize, minY + dy * tileDesc.ySize);

    int64_t tileMaxX = int64_t (tileMin[0]) + tileDesc.xSize - 1;
    int64_t tileMaxY = int64_t (tileMin[1]) + tileDesc.ySize - 1;

    V2i levelMax =
        dataWindowForLevel (tileDesc, minX, maxX, minY, maxY, lx, ly).max;

    V2i tileMax = V2i (
        std::min (tileMaxX, int64_t (levelMax[0])),
        std::min (tileMaxY, int64_t (levelMax[1])));

    return Box2i (tileMin, tileMax);
}